

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_option_version.c
# Opt level: O1

void test_option_version(void)

{
  byte bVar1;
  wchar_t wVar2;
  size_t in_RAX;
  char *_v1;
  char *pcVar3;
  char *pcVar4;
  ushort **ppuVar5;
  byte *pbVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  byte *_v1_00;
  size_t l;
  char *ld;
  size_t s;
  
  s = in_RAX;
  wVar2 = systemf("%s --version >version.stdout 2>version.stderr",testprog);
  if (wVar2 == L'\0') {
    wVar2 = L'\x01';
  }
  else {
    wVar2 = systemf("%s -W version >version.stdout 2>version.stderr",testprog);
    wVar2 = (wchar_t)(wVar2 == L'\0');
  }
  failure("Unable to run either %s --version or %s -W version",testprog);
  wVar2 = assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/cpio/test/test_option_version.c"
                           ,L'i',wVar2,"r == 0",(void *)0x0);
  if (wVar2 == L'\0') {
    return;
  }
  assertion_empty_file
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/cpio/test/test_option_version.c"
             ,L'm',"version.stderr");
  _v1 = slurpfile(&s,"version.stdout");
  failure("version message too short:",_v1);
  wVar2 = assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/cpio/test/test_option_version.c"
                           ,L'\'',(uint)(6 < s),"s > 6",(void *)0x0);
  if (wVar2 != L'\0') {
    failure("Version message should begin with \'bsdcpio\': %s",_v1);
    wVar2 = assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/cpio/test/test_option_version.c"
                                ,L'*',_v1,"q","bsdcpio ","\"bsdcpio \"",8,"8",(void *)0x0);
    if (wVar2 != L'\0') {
      pcVar3 = _v1 + 8;
      uVar9 = s - 8;
      if (uVar9 != 0) {
        do {
          if (*pcVar3 != '.' && 9 < (byte)(*pcVar3 - 0x30U)) goto LAB_00110a07;
          pcVar3 = pcVar3 + 1;
          uVar9 = uVar9 - 1;
        } while (uVar9 != 0);
        uVar9 = 0;
        pcVar3 = _v1 + s;
      }
LAB_00110a07:
      failure("Version: %s",_v1);
      assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/cpio/test/test_option_version.c"
                       ,L'5',(uint)(1 < uVar9),"s > 1",(void *)0x0);
      uVar8 = (ulong)((byte)(*pcVar3 + 0x9fU) < 4);
      failure("Version: %s",_v1);
      assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/cpio/test/test_option_version.c"
                       ,L':',(uint)(pcVar3[uVar8] == ' '),"*q == \' \'",(void *)0x0);
      failure("Version: %s",_v1);
      assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/cpio/test/test_option_version.c"
                          ,L'>',pcVar3 + uVar8 + 1,"q","-- ","\"-- \"",3,"3",(void *)0x0);
      assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/cpio/test/test_option_version.c"
                       ,L'A',(uint)(uVar9 - 0x10 < 0xfffffffffffffff4),"s > 11",(void *)0x0);
      failure("Version: %s",_v1);
      assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/cpio/test/test_option_version.c"
                          ,L'C',pcVar3 + uVar8 + 4,"q","libarchive ","\"libarchive \"",0xb,"11",
                          (void *)0x0);
      pcVar4 = pcVar3 + uVar8 + 0xf;
      lVar7 = uVar9 - 0xf;
      if (lVar7 != 0) {
        do {
          if (*pcVar4 != '.' && 9 < (byte)(*pcVar4 - 0x30U)) goto LAB_00110b89;
          pcVar4 = pcVar4 + 1;
          lVar7 = lVar7 + -1;
        } while (lVar7 != 0);
        lVar7 = 0;
        pcVar4 = pcVar3 + uVar9 + uVar8;
      }
LAB_00110b89:
      uVar9 = (ulong)((byte)(*pcVar4 + 0x9fU) < 4);
      _v1_00 = (byte *)(pcVar4 + uVar9);
      pbVar6 = _v1_00;
      if (lVar7 != 0) {
        pbVar6 = (byte *)(pcVar4 + uVar9 + lVar7);
        do {
          bVar1 = *_v1_00;
          if (((0x2f < (ulong)bVar1) || ((0xc00100000000U >> ((ulong)bVar1 & 0x3f) & 1) == 0)) &&
             (ppuVar5 = __ctype_b_loc(), ((*ppuVar5)[(char)bVar1] & 8) == 0)) {
            wVar2 = L'\x01';
            goto LAB_00110be2;
          }
          _v1_00 = _v1_00 + 1;
          lVar7 = lVar7 + -1;
        } while (lVar7 != 0);
      }
      wVar2 = L'\0';
      _v1_00 = pbVar6;
LAB_00110be2:
      assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/cpio/test/test_option_version.c"
                       ,L'S',wVar2,"s >= 1",(void *)0x0);
      failure("Version: %s",_v1);
      if (*_v1_00 == 0xd) {
        if (_v1_00[1] == 0) goto LAB_00110c8e;
        pcVar3 = "\r\n";
        pcVar4 = "\"\\x0d\\x0a\"";
        wVar2 = L'W';
        ld = "2";
        l = 2;
      }
      else {
        pcVar3 = "\n";
        pcVar4 = "\"\\x0a\"";
        wVar2 = L'Y';
        ld = "1";
        l = 1;
      }
      assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/cpio/test/test_option_version.c"
                          ,wVar2,_v1_00,"q",pcVar3,pcVar4,l,ld,(void *)0x0);
    }
  }
LAB_00110c8e:
  free(_v1);
  return;
}

Assistant:

DEFINE_TEST(test_option_version)
{
	int r;
	char *p;
	size_t s;

	r = systemf("%s --version >version.stdout 2>version.stderr", testprog);
	if (r != 0)
		r = systemf("%s -W version >version.stdout 2>version.stderr",
		    testprog);
	failure("Unable to run either %s --version or %s -W version",
	    testprog, testprog);
	if (!assert(r == 0))
		return;

	/* --version should generate nothing to stderr. */
	assertEmptyFile("version.stderr");
	/* Verify format of version message. */
	p = slurpfile(&s, "version.stdout");
	verify(p, s);
	free(p);
}